

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

crn_header * crnd::crnd_get_header(void *pData,uint32 data_size)

{
  uint uVar1;
  crn_header *file_header;
  uint32 data_size_local;
  void *pData_local;
  
  if ((pData == (void *)0x0) || (data_size < 0x4a)) {
    pData_local = (void *)0x0;
  }
  else {
    uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)pData);
    if (uVar1 == 0x4878) {
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)((long)pData + 2));
      if ((uVar1 < 0x4a) ||
         (uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)pData + 6)), pData_local = pData,
         data_size < uVar1)) {
        pData_local = (void *)0x0;
      }
    }
    else {
      pData_local = (void *)0x0;
    }
  }
  return (crn_header *)pData_local;
}

Assistant:

const crn_header* crnd_get_header(const void* pData, uint32 data_size)
    {
        if ((!pData) || (data_size < sizeof(crn_header)))
            return NULL;

        const crn_header& file_header = *static_cast<const crn_header*>(pData);
        if (file_header.m_sig != crn_header::cCRNSigValue)
            return NULL;

        if ((file_header.m_header_size < sizeof(crn_header)) || (data_size < file_header.m_data_size))
            return NULL;

        return &file_header;
    }